

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrb.h
# Opt level: O2

rrb<char,_false,_6> *
immutable::rrb_details::rrb_tail_push<char,false,6>
          (ref<immutable::rrb<char,_false,_6>_> *in,char element)

{
  rrb<char,_false,_6> *prVar1;
  rrb<char,_false,_6> *prVar2;
  ref<immutable::rrb_details::leaf_node<char,_false>_> local_20;
  
  prVar1 = rrb_head_clone<char,false,6>(in->ptr);
  prVar2 = ref<immutable::rrb<char,_false,_6>_>::operator->(in);
  local_20.ptr = leaf_node_inc<char,false>((prVar2->tail).ptr);
  (local_20.ptr)->child[prVar1->tail_len] = element;
  prVar1->cnt = prVar1->cnt + 1;
  prVar1->tail_len = prVar1->tail_len + 1;
  (local_20.ptr)->_ref_count = 1;
  ref<immutable::rrb_details::leaf_node<char,_false>_>::operator=(&prVar1->tail,&local_20);
  release<char>(local_20.ptr);
  return prVar1;
}

Assistant:

inline rrb<T, atomic_ref_counting, N>* rrb_tail_push(const ref<rrb<T, atomic_ref_counting, N>>& in, T element)
      {
      rrb<T, atomic_ref_counting, N>* new_rrb = rrb_head_clone(in.ptr);
      leaf_node<T, atomic_ref_counting>* new_tail = leaf_node_inc(in->tail.ptr);
      new_tail->child[new_rrb->tail_len] = std::move(element);
      new_rrb->cnt++;
      new_rrb->tail_len++;
      new_rrb->tail = new_tail;
      return new_rrb;
      }